

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFlyNode(comparer_context *comp)

{
  uint uVar1;
  sliced_chunk_reader reader;
  scoped_chunk chunk;
  sliced_chunk_iterator it;
  allocator<char> local_44a;
  allocator<char> local_449;
  string local_448;
  scoped_chunk local_428;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410 [63];
  
  local_428.ctx = comp;
  comparer_context::push_elem(comp,"aiNode");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"mName",&local_44a);
  comparer_context::cmp<aiString>((aiString *)local_420,comp,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"mTransformation",&local_44a);
  comparer_context::cmp<aiMatrix4x4t<float>>((aiMatrix4x4 *)local_420,comp,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_420,"mNumChildren",(allocator<char> *)&local_448);
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  std::__cxx11::string::~string((string *)local_420);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_420,"mNumMeshes",&local_44a);
  uVar1 = comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"mMeshes",&local_449);
  comparer_context::cmp<unsigned_int>(comp,(ulong)uVar1,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)local_420);
  local_448._M_dataplus._M_p = (pointer)comp;
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_420,(sliced_chunk_reader *)&local_448);
  while (local_410[0]._M_local_buf[0] != '\x01') {
    if ((float)local_420._8_4_ == 6.54126e-42) {
      CompareOnTheFlyNode(comp);
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_420);
  }
  sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_420);
  scoped_chunk::~scoped_chunk(&local_428);
  return;
}

Assistant:

void CompareOnTheFlyNode(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiNode");
    comp.cmp<aiString>("mName");
    comp.cmp<aiMatrix4x4>("mTransformation");
    comp.cmp<uint32_t>("mNumChildren");
    comp.cmp<uint32_t>(comp.cmp<uint32_t>("mNumMeshes"),"mMeshes");

    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AINODE) {
            CompareOnTheFlyNode(comp);
        }
    }
}